

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall
soul::RewritingASTVisitor::replaceStatement
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Statement> *s)

{
  Statement *pSVar1;
  Statement *pSVar2;
  
  if (s->object == (Statement *)0x0) {
    pSVar1 = (Statement *)0x0;
    pSVar2 = (Statement *)0x0;
  }
  else {
    pSVar1 = visitObject(this,s->object);
    pSVar2 = s->object;
  }
  if (pSVar2 != pSVar1) {
    this->itemsReplaced = this->itemsReplaced + 1;
    s->object = pSVar1;
  }
  return;
}

Assistant:

void replaceStatement (pool_ptr<AST::Statement>& s)           { replace (s, visitStatement (s)); }